

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_10031a4::cmEnumPathSegmentsGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmEnumPathSegmentsGenerator *this,string *parent)

{
  pointer pbVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_70 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  size_t local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  pbVar1 = (this->Current)._M_current;
  if (pbVar1 == (((this->Names)._M_data)->
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (this->Current)._M_current = pbVar1 + 1;
    local_50.first._M_str = (parent->_M_dataplus)._M_p;
    local_50.first._M_len = parent->_M_string_length;
    local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = local_70;
    local_70[0] = 0x2f;
    local_38 = 1;
    local_28 = 0;
    local_20 = pbVar1->_M_len;
    pcStack_18 = pbVar1->_M_str;
    local_10 = 0;
    views._M_len = 3;
    views._M_array = &local_50;
    cmCatViews(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Current != this->Names.get().cend()) {
      return cmStrCat(parent, '/', *this->Current++);
    }
    return {};
  }